

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookup.h
# Opt level: O0

void __thiscall verona::Lookup::Lookup(Lookup *this,Node *def)

{
  Node *def_local;
  Lookup *this_local;
  
  ::std::shared_ptr<trieste::NodeDef>::shared_ptr(&this->def,def);
  ::std::
  map<std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<trieste::NodeDef>,_std::owner_less<void>,_std::allocator<std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<trieste::NodeDef>_>_>_>
  ::map(&this->bindings);
  this->too_many_typeargs = false;
  return;
}

Assistant:

Lookup(Node def) : def(def) {}